

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigTsim.c
# Opt level: O0

int Aig_XsimInv(int Value)

{
  int local_c;
  int Value_local;
  
  if (Value == 1) {
    local_c = 2;
  }
  else if (Value == 2) {
    local_c = 1;
  }
  else {
    if (Value != 3) {
      __assert_fail("Value == AIG_XVSX",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigTsim.c"
                    ,0x2e,"int Aig_XsimInv(int)");
    }
    local_c = 3;
  }
  return local_c;
}

Assistant:

static inline int  Aig_XsimInv( int Value )   
{ 
    if ( Value == AIG_XVS0 )
        return AIG_XVS1;
    if ( Value == AIG_XVS1 )
        return AIG_XVS0;
    assert( Value == AIG_XVSX );       
    return AIG_XVSX;
}